

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswIslands.c
# Opt level: O1

Vec_Int_t * Ssw_MatchingPairs(Aig_Man_t *p0,Aig_Man_t *p1)

{
  void *pvVar1;
  long lVar2;
  Vec_Int_t *p;
  int *piVar3;
  Vec_Ptr_t *pVVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  
  if (p0->nObjs[2] != p1->nObjs[2]) {
    __assert_fail("Aig_ManCiNum(p0) == Aig_ManCiNum(p1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswIslands.c"
                  ,0x152,"Vec_Int_t *Ssw_MatchingPairs(Aig_Man_t *, Aig_Man_t *)");
  }
  if (p0->nObjs[3] != p1->nObjs[3]) {
    __assert_fail("Aig_ManCoNum(p0) == Aig_ManCoNum(p1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswIslands.c"
                  ,0x153,"Vec_Int_t *Ssw_MatchingPairs(Aig_Man_t *, Aig_Man_t *)");
  }
  if (p0->nRegs != p1->nRegs) {
    __assert_fail("Aig_ManRegNum(p0) == Aig_ManRegNum(p1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswIslands.c"
                  ,0x154,"Vec_Int_t *Ssw_MatchingPairs(Aig_Man_t *, Aig_Man_t *)");
  }
  iVar6 = p0->vObjs->nSize - p0->nDeleted;
  if (iVar6 == p1->vObjs->nSize - p1->nDeleted) {
    p = (Vec_Int_t *)malloc(0x10);
    iVar5 = 0x10;
    if (0xe < iVar6 * 2 - 1U) {
      iVar5 = iVar6 * 2;
    }
    p->nSize = 0;
    p->nCap = iVar5;
    if (iVar5 == 0) {
      piVar3 = (int *)0x0;
    }
    else {
      piVar3 = (int *)malloc((long)iVar5 << 2);
    }
    p->pArray = piVar3;
    pVVar4 = p0->vObjs;
    if (0 < pVVar4->nSize) {
      lVar7 = 0;
      do {
        pvVar1 = pVVar4->pArray[lVar7];
        if ((pvVar1 != (void *)0x0) && ((*(uint *)((long)pvVar1 + 0x18) & 7) != 3)) {
          lVar2 = *(long *)((long)pvVar1 + 0x28);
          Vec_IntPush(p,*(int *)((long)pvVar1 + 0x24));
          Vec_IntPush(p,*(int *)(lVar2 + 0x24));
        }
        lVar7 = lVar7 + 1;
        pVVar4 = p0->vObjs;
      } while (lVar7 < pVVar4->nSize);
    }
    return p;
  }
  __assert_fail("Aig_ManObjNum(p0) == Aig_ManObjNum(p1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswIslands.c"
                ,0x155,"Vec_Int_t *Ssw_MatchingPairs(Aig_Man_t *, Aig_Man_t *)");
}

Assistant:

Vec_Int_t * Ssw_MatchingPairs( Aig_Man_t * p0, Aig_Man_t * p1 )
{
    Vec_Int_t * vPairsNew;
    Aig_Obj_t * pObj0, * pObj1;
    int i;
    // check correctness
    assert( Aig_ManCiNum(p0) == Aig_ManCiNum(p1) );
    assert( Aig_ManCoNum(p0) == Aig_ManCoNum(p1) );
    assert( Aig_ManRegNum(p0) == Aig_ManRegNum(p1) );
    assert( Aig_ManObjNum(p0) == Aig_ManObjNum(p1) );
    // create complete pairs
    vPairsNew = Vec_IntAlloc( 2*Aig_ManObjNum(p0) );
    Aig_ManForEachObj( p0, pObj0, i )
    {
        if ( Aig_ObjIsCo(pObj0) )
            continue;
        pObj1 = (Aig_Obj_t *)pObj0->pData;
        Vec_IntPush( vPairsNew, pObj0->Id );
        Vec_IntPush( vPairsNew, pObj1->Id );
    }
    return vPairsNew;
}